

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

optional<diy::mpi::status> * __thiscall
diy::mpi::request::test(optional<diy::mpi::status> *__return_storage_ptr__,request *this)

{
  int flag;
  status s;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  MPI_Test(this,&local_2c,&local_28);
  if (local_2c != 0) {
    *(undefined8 *)(__return_storage_ptr__->buf_ + 0x10) = local_18;
    *(undefined8 *)__return_storage_ptr__->buf_ = local_28;
    *(undefined8 *)(__return_storage_ptr__->buf_ + 8) = uStack_20;
  }
  __return_storage_ptr__->init_ = local_2c != 0;
  return __return_storage_ptr__;
}

Assistant:

diy::mpi::optional<diy::mpi::status> diy::mpi::request::test()
{
#if DIY_HAS_MPI
  status s;
  int flag;
  MPI_Test(&mpi_cast(handle), &flag, &mpi_cast(s.handle));
  if (flag)
    return s;
#endif
  return optional<status>();
}